

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metadata.c
# Opt level: O3

int read_metadata_buff(WavpackContext *wpc,WavpackMetadata *wpmd)

{
  byte bVar1;
  int32_t iVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  long in_FS_OFFSET;
  uchar tchar;
  byte local_31;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  iVar2 = (*wpc->infile)(&wpmd->id,1);
  iVar5 = 0;
  iVar4 = 0;
  if (iVar2 != 0) {
    iVar2 = (*wpc->infile)(&local_31,1);
    iVar4 = iVar5;
    if (iVar2 != 0) {
      uVar3 = (uint)local_31 * 2;
      wpmd->byte_length = uVar3;
      bVar1 = wpmd->id;
      if ((char)bVar1 < '\0') {
        wpmd->id = bVar1 & 0x7f;
        iVar2 = (*wpc->infile)(&local_31,1);
        if (iVar2 == 0) goto LAB_001aefe4;
        wpmd->byte_length = wpmd->byte_length + (uint)local_31 * 0x200;
        iVar2 = (*wpc->infile)(&local_31,1);
        if (iVar2 == 0) goto LAB_001aefe4;
        uVar3 = (uint)local_31 * 0x20000 + wpmd->byte_length;
        wpmd->byte_length = uVar3;
        bVar1 = wpmd->id;
      }
      if ((bVar1 & 0x40) != 0) {
        wpmd->id = bVar1 & 0xbf;
        uVar3 = uVar3 - 1;
        wpmd->byte_length = uVar3;
      }
      if (uVar3 - 1 < 0x400) {
        iVar5 = (uVar3 & 1) + uVar3;
        iVar2 = (*wpc->infile)(wpc->read_buffer,iVar5);
        if (iVar2 != iVar5) {
          wpmd->data = (void *)0x0;
          goto LAB_001aefe4;
        }
        wpmd->data = wpc->read_buffer;
      }
      else {
        wpmd->data = (void *)0x0;
      }
      iVar4 = 1;
    }
  }
LAB_001aefe4:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return iVar4;
  }
  __stack_chk_fail();
}

Assistant:

int read_metadata_buff (WavpackContext *wpc, WavpackMetadata *wpmd)
{
    uchar tchar;

    if (!wpc->infile (&wpmd->id, 1) || !wpc->infile (&tchar, 1))
        return FALSE;

    wpmd->byte_length = tchar << 1;

    if (wpmd->id & ID_LARGE) {
        wpmd->id &= ~ID_LARGE;

        if (!wpc->infile (&tchar, 1))
            return FALSE;

        wpmd->byte_length += (int32_t) tchar << 9; 

        if (!wpc->infile (&tchar, 1))
            return FALSE;

        wpmd->byte_length += (int32_t) tchar << 17;
    }

    if (wpmd->id & ID_ODD_SIZE) {
        wpmd->id &= ~ID_ODD_SIZE;
        wpmd->byte_length--;
    }

    if (wpmd->byte_length && wpmd->byte_length <= sizeof (wpc->read_buffer)) {
        uint32_t bytes_to_read = wpmd->byte_length + (wpmd->byte_length & 1);

        if (wpc->infile (wpc->read_buffer, bytes_to_read) != (int32_t) bytes_to_read) {
            wpmd->data = NULL;
            return FALSE;
        }

        wpmd->data = wpc->read_buffer;
    }
    else
        wpmd->data = NULL;

    return TRUE;
}